

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_add_quality(REF_HISTOGRAM ref_histogram,REF_GRID ref_grid)

{
  REF_STATUS RVar1;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL quality;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_GRID ref_grid_local;
  REF_HISTOGRAM ref_histogram_local;
  
  if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
    unique0x00012000 = ref_grid->cell[8];
  }
  else {
    unique0x00012000 = ref_grid->cell[3];
  }
  nodes[0x19] = 0;
  do {
    if (stack0xffffffffffffffd8->max <= nodes[0x19]) {
      ref_histogram_local._4_4_ = ref_histogram_gather(ref_histogram,ref_grid->mpi);
      if (ref_histogram_local._4_4_ == 0) {
        ref_histogram_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x1c4,"ref_histogram_add_quality",(ulong)ref_histogram_local._4_4_,"gather");
      }
      return ref_histogram_local._4_4_;
    }
    RVar1 = ref_cell_nodes(stack0xffffffffffffffd8,nodes[0x19],(REF_INT *)&quality);
    if ((RVar1 == 0) && (ref_grid->node->part[quality._0_4_] == ref_grid->mpi->id)) {
      if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
        uVar2 = ref_node_tet_quality
                          (ref_grid->node,(REF_INT *)&quality,
                           (REF_DBL *)&ref_private_macro_code_rss_1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x1be,"ref_histogram_add_quality",(ulong)uVar2,"qual");
          return uVar2;
        }
      }
      else {
        uVar2 = ref_node_tri_quality
                          (ref_grid->node,(REF_INT *)&quality,
                           (REF_DBL *)&ref_private_macro_code_rss_1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x1bb,"ref_histogram_add_quality",(ulong)uVar2,"qual");
          return uVar2;
        }
      }
      if ((0.0 < _ref_private_macro_code_rss_1) &&
         (uVar2 = ref_histogram_add(ref_histogram,_ref_private_macro_code_rss_1), uVar2 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x1c0,"ref_histogram_add_quality",(ulong)uVar2,"add");
        return uVar2;
      }
    }
    nodes[0x19] = nodes[0x19] + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_histogram_add_quality(REF_HISTOGRAM ref_histogram,
                                             REF_GRID ref_grid) {
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality;

  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_node_part(ref_grid_node(ref_grid), nodes[0]) ==
        ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
        RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
            "qual");
      } else {
        RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
            "qual");
      }
      if (quality > 0.0) RSS(ref_histogram_add(ref_histogram, quality), "add");
    }
  }

  RSS(ref_histogram_gather(ref_histogram, ref_grid_mpi(ref_grid)), "gather");

  return REF_SUCCESS;
}